

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O0

double __thiscall P2Pt::pose_poly<double>::fn_t(pose_poly<double> *this,double t,double *o)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double t2p13;
  double t2p12;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double t3;
  double t2;
  double *L;
  double *K;
  double *J;
  double *H;
  double *G;
  double *F;
  double *E;
  double *C;
  double *B;
  double *A;
  double L3;
  double L2;
  double K3;
  double K2;
  double J3;
  double J2;
  double H4;
  double H3;
  double H2;
  double G2;
  double F2;
  double E2;
  double C2;
  double B2;
  double A2;
  double t2p14;
  
  pdVar15 = in_RSI + 1;
  pdVar16 = in_RSI + 2;
  pdVar17 = in_RSI + 3;
  pdVar18 = in_RSI + 4;
  pdVar19 = in_RSI + 5;
  pdVar20 = in_RSI + 6;
  pdVar21 = in_RSI + 7;
  pdVar22 = in_RSI + 8;
  pdVar23 = in_RSI + 9;
  dVar1 = in_XMM0_Qa * in_XMM0_Qa;
  dVar2 = dVar1 * in_XMM0_Qa;
  dVar3 = dVar2 * in_XMM0_Qa;
  dVar4 = dVar3 * in_XMM0_Qa;
  dVar5 = dVar4 * in_XMM0_Qa;
  dVar6 = dVar5 * in_XMM0_Qa;
  dVar7 = dVar6 * in_XMM0_Qa;
  dVar8 = (dVar1 + 1.0) * (dVar1 + 1.0);
  dVar9 = dVar8 * (dVar1 + 1.0);
  dVar10 = dVar9 * (dVar1 + 1.0);
  *in_RSI = (((*in_RDI + in_RDI[1] * in_XMM0_Qa + in_RDI[2] * dVar1) - in_RDI[1] * dVar2) +
            *in_RDI * dVar3) / dVar8;
  *pdVar15 = ((((in_RDI[3] + in_RDI[4] * in_XMM0_Qa + in_RDI[5] * dVar1 + in_RDI[6] * dVar2) -
               in_RDI[5] * dVar3) + in_RDI[4] * dVar4) - in_RDI[3] * dVar5) / dVar9;
  *pdVar16 = (((((in_RDI[7] + in_RDI[8] * in_XMM0_Qa + in_RDI[9] * dVar1 + in_RDI[10] * dVar2 +
                 in_RDI[0xb] * dVar3) - in_RDI[10] * dVar4) + in_RDI[9] * dVar5) - in_RDI[8] * dVar6
              ) + in_RDI[7] * dVar7) / dVar10;
  *pdVar17 = (((in_RDI[0xc] + in_RDI[0xd] * in_XMM0_Qa + in_RDI[0xe] * dVar1) - in_RDI[0xd] * dVar2)
             + in_RDI[0xc] * dVar3) / dVar8;
  *pdVar18 = ((((in_RDI[0xf] + in_RDI[0x10] * in_XMM0_Qa + in_RDI[0x11] * dVar1 +
                in_RDI[0x12] * dVar2) - in_RDI[0x11] * dVar3) + in_RDI[0x10] * dVar4) -
             in_RDI[0xf] * dVar5) / dVar9;
  *pdVar19 = (((((in_RDI[0x13] + in_RDI[0x14] * in_XMM0_Qa + in_RDI[0x15] * dVar1 +
                  in_RDI[0x16] * dVar2 + in_RDI[0x17] * dVar3) - in_RDI[0x16] * dVar4) +
               in_RDI[0x15] * dVar5) - in_RDI[0x14] * dVar6) + in_RDI[0x13] * dVar7) / dVar10;
  *pdVar20 = (((((in_RDI[0x18] + in_RDI[0x19] * in_XMM0_Qa + in_RDI[0x1a] * dVar1 +
                  in_RDI[0x1b] * dVar2 + in_RDI[0x1c] * dVar3) - in_RDI[0x1b] * dVar4) +
               in_RDI[0x1a] * dVar5) - in_RDI[0x19] * dVar6) + in_RDI[0x18] * dVar7) / dVar10;
  *pdVar21 = ((((in_RDI[0x1d] + in_RDI[0x1e] * in_XMM0_Qa + in_RDI[0x1f] * dVar1 +
                in_RDI[0x20] * dVar2) - in_RDI[0x1f] * dVar3) + in_RDI[0x1e] * dVar4) -
             in_RDI[0x1d] * dVar5) / dVar9;
  *pdVar22 = ((((in_RDI[0x21] + in_RDI[0x22] * in_XMM0_Qa + in_RDI[0x23] * dVar1 +
                in_RDI[0x24] * dVar2) - in_RDI[0x23] * dVar3) + in_RDI[0x22] * dVar4) -
             in_RDI[0x21] * dVar5) / dVar9;
  *pdVar23 = (((in_RDI[0x25] + in_RDI[0x26] * in_XMM0_Qa + in_RDI[0x27] * dVar1) -
              in_RDI[0x26] * dVar2) + in_RDI[0x25] * dVar3) / dVar8;
  dVar1 = *in_RSI * *in_RSI;
  dVar2 = *pdVar15 * *pdVar15;
  dVar3 = *pdVar16 * *pdVar16;
  dVar4 = *pdVar17 * *pdVar17;
  dVar5 = *pdVar18 * *pdVar18;
  dVar6 = *pdVar19 * *pdVar19;
  dVar7 = *pdVar20 * *pdVar20;
  dVar8 = dVar7 * *pdVar20;
  dVar9 = *pdVar21 * *pdVar21;
  dVar10 = dVar9 * *pdVar21;
  dVar11 = *pdVar22 * *pdVar22;
  dVar12 = dVar11 * *pdVar22;
  dVar13 = *pdVar23 * *pdVar23;
  dVar14 = dVar13 * *pdVar23;
  return dVar4 * dVar2 * dVar7 * dVar9 + dVar6 * dVar3 * *pdVar23 * *pdVar23 * *pdVar23 * *pdVar23 +
         dVar6 * dVar1 * dVar12 * *pdVar22 + dVar4 * dVar1 * dVar8 * *pdVar20 +
         dVar4 * dVar3 * dVar10 * *pdVar21 +
         *pdVar17 * -2.0 * *in_RSI * dVar7 * *pdVar19 * *pdVar16 * dVar13 +
         dVar4 * 2.0 * *in_RSI * dVar7 * *pdVar16 * dVar9 +
         dVar4 * -2.0 * *pdVar16 * dVar10 * *pdVar15 * *pdVar20 +
         *pdVar17 * 2.0 * dVar3 * dVar9 * *pdVar19 * dVar13 +
         *pdVar17 * 2.0 * dVar1 * dVar7 * *pdVar19 * dVar11 +
         dVar4 * -2.0 * *in_RSI * dVar8 * *pdVar15 * *pdVar21 +
         *pdVar17 * -2.0 * *in_RSI * dVar7 * *pdVar19 * *pdVar15 * *pdVar22 * *pdVar23 +
         *pdVar17 * -2.0 * *pdVar16 * dVar9 * *pdVar19 * *pdVar15 * *pdVar22 * *pdVar23 +
         *pdVar17 * -2.0 * *pdVar16 * dVar9 * *pdVar19 * *in_RSI * dVar11 +
         *pdVar17 * -2.0 * *pdVar15 * *pdVar20 * *pdVar21 * *pdVar19 * *pdVar16 * dVar13 +
         *pdVar17 * -2.0 * *pdVar15 * *pdVar20 * *pdVar21 * *pdVar19 * *in_RSI * dVar11 +
         dVar6 * dVar2 * dVar11 * dVar13 + dVar6 * -2.0 * *pdVar15 * *pdVar22 * dVar14 * *pdVar16 +
         dVar6 * -2.0 * *pdVar15 * dVar12 * *pdVar23 * *in_RSI +
         dVar6 * 2.0 * *pdVar16 * dVar13 * *in_RSI * dVar11 +
         *pdVar18 * -2.0 * *pdVar17 * dVar1 * dVar8 * *pdVar22 +
         *pdVar18 * -2.0 * *pdVar17 * *in_RSI * *pdVar20 * *pdVar22 * *pdVar16 * dVar9 +
         *pdVar18 * 3.0 * *pdVar17 * *in_RSI * dVar7 * *pdVar22 * *pdVar15 * *pdVar21 +
         *pdVar18 * 3.0 * *in_RSI * *pdVar20 * dVar11 * *pdVar19 * *pdVar15 * *pdVar23 +
         *pdVar18 * -2.0 * *in_RSI * *pdVar20 * *pdVar22 * *pdVar19 * *pdVar16 * dVar13 +
         *pdVar18 * -2.0 * dVar1 * *pdVar20 * dVar12 * *pdVar19 +
         *pdVar18 * *pdVar17 * *pdVar15 * dVar8 * *pdVar23 * *in_RSI +
         *pdVar18 * 3.0 * *pdVar17 * *pdVar15 * *pdVar20 * *pdVar23 * *pdVar16 * dVar9 +
         *pdVar18 * -1.0 * *pdVar17 * dVar2 * dVar7 * *pdVar23 * *pdVar21 +
         *pdVar18 * -1.0 * dVar2 * *pdVar20 * dVar13 * *pdVar19 * *pdVar22 +
         *pdVar18 * *pdVar15 * *pdVar20 * dVar14 * *pdVar19 * *pdVar16 +
         *pdVar18 * *pdVar17 * *pdVar15 * *pdVar22 * dVar10 * *pdVar16 +
         *pdVar18 * -1.0 * *pdVar17 * dVar2 * *pdVar22 * dVar9 * *pdVar20 +
         *pdVar18 * -1.0 * dVar2 * dVar11 * *pdVar21 * *pdVar19 * *pdVar23 +
         *pdVar18 * 3.0 * *pdVar15 * *pdVar22 * *pdVar21 * *pdVar19 * *pdVar16 * dVar13 +
         *pdVar18 * *pdVar15 * dVar12 * *pdVar21 * *pdVar19 * *in_RSI +
         *pdVar18 * -2.0 * *pdVar17 * *pdVar16 * *pdVar21 * *pdVar23 * *in_RSI * dVar7 +
         *pdVar18 * -2.0 * *pdVar17 * dVar3 * dVar10 * *pdVar23 +
         *pdVar18 * -2.0 * dVar3 * *pdVar21 * dVar14 * *pdVar19 +
         *pdVar18 * -2.0 * *pdVar16 * *pdVar21 * *pdVar23 * *pdVar19 * *in_RSI * dVar11 +
         dVar5 * dVar1 * dVar11 * dVar7 + dVar5 * *in_RSI * dVar11 * *pdVar16 * dVar9 +
         dVar5 * -1.0 * *in_RSI * dVar11 * *pdVar15 * *pdVar20 * *pdVar21 +
         dVar5 * -1.0 * *pdVar15 * *pdVar22 * *pdVar23 * *in_RSI * dVar7 +
         dVar5 * -1.0 * *pdVar15 * *pdVar22 * *pdVar23 * *pdVar16 * dVar9 +
         dVar5 * dVar2 * *pdVar22 * *pdVar23 * *pdVar20 * *pdVar21 +
         dVar5 * *pdVar16 * dVar13 * *in_RSI * dVar7 + dVar5 * dVar3 * dVar13 * dVar9 +
         dVar5 * -1.0 * *pdVar16 * dVar13 * *pdVar15 * *pdVar20 * *pdVar21 +
         *pdVar19 * *pdVar17 * dVar2 * dVar7 * dVar13 + *pdVar19 * *pdVar17 * dVar2 * dVar11 * dVar9
         + *pdVar19 * 8.0 * *pdVar17 * *in_RSI * *pdVar20 * *pdVar22 * *pdVar16 * *pdVar21 *
           *pdVar23;
}

Assistant:

inline T fn_t(const T t, T o[10]) {  //o: output
    T &A = o[0]; T &B = o[1]; T &C = o[2]; T &E = o[3]; T &F = o[4]; 
    T &G = o[5]; T &H = o[6]; T &J = o[7]; T &K = o[8]; T &L = o[9];

    //%function of t part :
    const T t2 = t*t, t3 = t2*t, t4 = t3*t, t5 = t4*t, t6 = t5*t, t7 = t6*t, t8 = t7*t;
    const T t2p12 = (t2 + 1.) * (t2 + 1.), t2p13 = t2p12 * (t2 + 1.), t2p14 = t2p13 * (t2 + 1.);

    A = (A0+A1*t+A2*t2-A1*t3+A0*t4)/t2p12;
    B = (B0+B1*t+B2*t2+B3*t3-B2*t4+B1*t5-B0*t6)/t2p13;
    C = (C0+C1*t+C2*t2+C3*t3+C4*t4-C3*t5+C2*t6-C1*t7+C0*t8)/t2p14;
    E = (E0+E1*t+E2*t2-E1*t3+E0*t4)/t2p12;
    F = (F0+F1*t+F2*t2+F3*t3-F2*t4+F1*t5-F0*t6)/t2p13;
    G = (G0+G1*t+G2*t2+G3*t3+G4*t4-G3*t5+G2*t6-G1*t7+G0*t8)/t2p14;
    H = (H0+H1*t+H2*t2+H3*t3+H4*t4-H3*t5+H2*t6-H1*t7+H0*t8)/t2p14;
    J = (J0+J1*t+J2*t2+J3*t3-J2*t4+J1*t5-J0*t6)/t2p13;
    K = (K0+K1*t+K2*t2+K3*t3-K2*t4+K1*t5-K0*t6)/t2p13;
    L = (L0+L1*t+L2*t2-L1*t3+L0*t4)/t2p12;

    const T A2=A*A, B2=B*B, C2=C*C, E2=E*E, F2=F*F, G2=G*G, H2=H*H, 
            H3=H2*H, H4=H3*H, J2=J*J, J3=J2*J, K2=K*K, K3=K2*K, L2=L*L, L3=L2*L;
    
    return E2*B2*H2*J2 +G2*C2*L*L*L*L +G2*A2*K3*K +E2*A2*H4 +E2*C2*J3*J
    +-2.*E*A*H2*G*C*L2 +2.*E2*A*H2*C*J2 +-2.*E2*C*J3*B*H +2.*E*C2*J2*G*L2
    +2.*E*A2*H2*G*K2 +-2.*E2*A*H3*B*J +-2.*E*A*H2*G*B*K*L +-2.*E*C*J2*G*B*K*L
    +-2.*E*C*J2*G*A*K2 +-2.*E*B*H*J*G*C*L2 +-2.*E*B*H*J*G*A*K2 +G2*B2*K2*L2
    +-2.*G2*B*K*L3*C +-2.*G2*B*K3*L*A +2.*G2*C*L2*A*K2 +-2.*F*E*A2*H3*K
    +-2.*F*E*A*H*K*C*J2 +3.*F*E*A*H2*K*B*J +3.*F*A*H*K2*G*B*L
    +-2.*F*A*H*K*G*C*L2 +-2.*F*A2*H*K3*G +F*E*B*H3*L*A +3.*F*E*B*H*L*C*J2
    +-1.*F*E*B2*H2*L*J +-1.*F*B2*H*L2*G*K +F*B*H*L3*G*C +F*E*B*K*J3*C
    +-1.*F*E*B2*K*J2*H +-1.*F*B2*K2*J*G*L +3.*F*B*K*J*G*C*L2 +F*B*K3*J*G*A
    +-2.*F*E*C*J*L*A*H2 +-2.*F*E*C2*J3*L +-2.*F*C2*J*L3*G +-2.*F*C*J*L*G*A*K2
    +F2*A2*K2*H2 +F2*A*K2*C*J2 +-1.*F2*A*K2*B*H*J +-1.*F2*B*K*L*A*H2
    +-1.*F2*B*K*L*C*J2 +F2*B2*K*L*H*J +F2*C*L2*A*H2 +F2*C2*L2*J2
    +-1.*F2*C*L2*B*H*J +G*E*B2*H2*L2 +G*E*B2*K2*J2 +8.*G*E*A*H*K*C*J*L;
  }